

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O2

H265eDpbFrm * get_ref_pic(H265eDpbFrm *frame_list,RK_S32 poc)

{
  long lVar1;
  H265eDpbFrm *pHVar2;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","get_ref_pic");
  }
  lVar1 = 0;
  pHVar2 = (H265eDpbFrm *)0x0;
  do {
    if (lVar1 == 0x600) {
LAB_001c279a:
      if (((byte)h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_slice","leave\n","get_ref_pic");
      }
      return pHVar2;
    }
    if ((*(int *)((long)&frame_list->inited + lVar1) != 0) &&
       (*(int *)((long)&frame_list->poc + lVar1) == poc)) {
      pHVar2 = (H265eDpbFrm *)((long)&frame_list->dpb + lVar1);
      goto LAB_001c279a;
    }
    pHVar2 = (H265eDpbFrm *)((long)&frame_list->dpb + lVar1);
    lVar1 = lVar1 + 0x60;
  } while( true );
}

Assistant:

H265eDpbFrm* get_ref_pic(H265eDpbFrm *frame_list, RK_S32 poc)
{
    RK_S32 index = 0;
    H265eDpbFrm *frame = NULL;

    h265e_dbg_func("enter\n");
    for (index = 0; index < MAX_REFS; index++) {
        frame = &frame_list[index];
        if (frame->inited && frame->poc == poc) {
            break;
        }
    }
    h265e_dbg_func("leave\n");
    return frame;
}